

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool __thiscall picojson::default_parse_context::parse_object_start(default_parse_context *this)

{
  pointer *ppvVar1;
  _Base_ptr *pp_Var2;
  int iVar3;
  value *pvVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  *this_00;
  array *paVar5;
  ulong uVar6;
  
  uVar6 = 0x30;
  paVar5 = (array *)operator_new(0x30);
  ppvVar1 = &(paVar5->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl
             .super__Vector_impl_data._M_finish;
  (paVar5->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar5[1].super__Vector_base<picojson::value,_std::allocator<picojson::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (paVar5->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (paVar5->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar5[1].super__Vector_base<picojson::value,_std::allocator<picojson::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppvVar1;
  paVar5[1].super__Vector_base<picojson::value,_std::allocator<picojson::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)ppvVar1;
  paVar5[1].super__Vector_base<picojson::value,_std::allocator<picojson::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar4 = this->out_;
  iVar3 = pvVar4->type_;
  pvVar4->type_ = 5;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
             *)(pvVar4->u_).array_;
  (pvVar4->u_).array_ = paVar5;
  if (iVar3 == 5) {
    if (this_00 !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
      ::~_Rb_tree(this_00);
    }
  }
  else if (iVar3 == 4) {
    uVar6 = 0x18;
    if (this_00 !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                ((vector<picojson::value,_std::allocator<picojson::value>_> *)this_00);
    }
  }
  else {
    if (iVar3 != 3) {
      return true;
    }
    uVar6 = 0x20;
    if (this_00 !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      pp_Var2 = &(this_00->_M_impl).super__Rb_tree_header._M_header._M_parent;
      if ((_Base_ptr *)*(undefined1 **)&this_00->_M_impl != pp_Var2) {
        operator_delete(*(undefined1 **)&this_00->_M_impl,(ulong)((long)&(*pp_Var2)->_M_color + 1));
      }
    }
  }
  operator_delete(this_00,uVar6);
  return true;
}

Assistant:

bool parse_object_start() {
    *out_ = value(object_type, false);
    return true;
  }